

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

void __thiscall BMP::writeCodesOfSymbols(BMP *this,typeOfCode type,ofstream *out)

{
  GreyCount *__first;
  anon_class_24_3_78e20883 __f;
  anon_class_24_3_78e20883 local_88;
  long local_70;
  bool *pbStack_68;
  ofstream **local_60;
  string local_48 [8];
  string title;
  bool local_21;
  ofstream *poStack_20;
  bool flag;
  ofstream *out_local;
  BMP *pBStack_10;
  typeOfCode type_local;
  BMP *this_local;
  
  local_21 = out != (ofstream *)0x0;
  poStack_20 = out;
  out_local._4_4_ = type;
  pBStack_10 = this;
  std::__cxx11::string::string(local_48);
  if (out_local._4_4_ == UNIFORM) {
    std::__cxx11::string::operator=(local_48,"Uniform Code of symbols: \n");
  }
  else if (out_local._4_4_ == HUFFMAN) {
    std::__cxx11::string::operator=(local_48,"Huffman\'s Code of symbols: \n");
  }
  else if (out_local._4_4_ == SHANNON) {
    std::__cxx11::string::operator=(local_48,"Shannon\'s Code of symbols: \n");
  }
  if ((local_21 & 1U) == 0) {
    std::operator<<((ostream *)&std::cout,local_48);
  }
  else {
    std::operator<<((ostream *)poStack_20,local_48);
  }
  __first = this->alphabet->symbol;
  local_70 = (long)&out_local + 4;
  pbStack_68 = &local_21;
  local_60 = &stack0xffffffffffffffe0;
  __f.flag = pbStack_68;
  __f.type = (typeOfCode *)local_70;
  __f.out = local_60;
  std::for_each<bitMap::GreyCount*,BMP::writeCodesOfSymbols(typeOfCode,std::ofstream*)::__0>
            (&local_88,__first,__first + this->alphabet->num,__f);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void BMP::writeCodesOfSymbols(  typeOfCode type, std::ofstream *out ) {
    using namespace std;
    bool flag;
    if ( out != nullptr ) {
        flag = true;
    } else {
        flag = false;
    }

    string title;

    switch( type ){
        case SHANNON:
            title = "Shannon's Code of symbols: \n";
            break;
        case UNIFORM:
            title = "Uniform Code of symbols: \n";
            break;
        case HUFFMAN:
            title = "Huffman's Code of symbols: \n";
            break;
    }

    if ( flag ) {
        (*out) << title;
    } else{
        cout << title;
    }

    for_each(alphabet->symbol, alphabet->symbol+alphabet->num, [&](bitMap::GreyCount a) {
        switch (type) {
            case SHANNON:
                if (flag) {
                    (*out) << setw(3) << (int) a.tone << ": " << a.codeShannonFano << '\n';
                } else {
                    cout << setw(3) << (int) a.tone << ": " << a.codeShannonFano << '\n';
                }
                break;
            case UNIFORM:
                if (flag) {
                    (*out) << setw(3) << (int) a.tone << ": " << a.uniformCodes << '\n';
                } else {
                    cout << setw(3) << (int) a.tone << ": " << a.uniformCodes << '\n';
                };
                break;
            case HUFFMAN:
                if (flag) {
                    (*out) << setw(3) << (int) a.tone << ": " << a.codeHuffman << '\n';
                } else {
                    cout << setw(3) << (int) a.tone << ": " << a.codeHuffman << '\n';
                }
                break;
        }
    });
}